

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O0

void __thiscall
highwayhash::DurationsForInputs::DurationsForInputs
          (DurationsForInputs *this,FuncInput *inputs,size_t num_inputs,size_t max_durations)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  float *pfVar4;
  Item *pIVar5;
  ulong local_30;
  size_t i;
  size_t max_durations_local;
  size_t num_inputs_local;
  FuncInput *inputs_local;
  DurationsForInputs *this_local;
  
  this->num_items = 0;
  this->inputs_ = inputs;
  this->num_inputs_ = num_inputs;
  this->max_durations_ = max_durations;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = num_inputs * max_durations;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  this->all_durations_ = pfVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = num_inputs;
  uVar3 = SUB168(auVar2 * ZEXT816(0x18),0);
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pIVar5 = (Item *)operator_new__(uVar3);
  this->items = pIVar5;
  for (local_30 = 0; local_30 < this->num_inputs_; local_30 = local_30 + 1) {
    this->items[local_30].input = 0;
    this->items[local_30].num_durations = 0;
    this->items[local_30].durations = this->all_durations_ + local_30 * max_durations;
  }
  return;
}

Assistant:

DurationsForInputs::DurationsForInputs(const FuncInput* inputs,
                                       const size_t num_inputs,
                                       const size_t max_durations)
    : num_items(0),
      inputs_(inputs),
      num_inputs_(num_inputs),
      max_durations_(max_durations),
      all_durations_(new float[num_inputs * max_durations]) {
  NANOBENCHMARK_CHECK(num_inputs != 0);
  NANOBENCHMARK_CHECK(max_durations != 0);

  items = new Item[num_inputs];
  for (size_t i = 0; i < num_inputs_; ++i) {
    items[i].input = 0;  // initialized later
    items[i].num_durations = 0;
    items[i].durations = all_durations_ + i * max_durations;
  }
}